

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O1

void __thiscall Json::Value::resize(Value *this,ArrayIndex newSize)

{
  _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
  *this_00;
  ArrayIndex AVar1;
  ArrayIndex i;
  ArrayIndex AVar2;
  pair<std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
  pVar3;
  OStringStream oss;
  String SStack_1c8;
  ValueHolder local_1a8;
  ArrayIndex local_1a0;
  undefined1 local_198 [360];
  
  if (*(char *)&this->bits_ == '\0') {
    Value((Value *)&local_1a8,arrayValue);
    swap((Value *)&local_1a8,this);
    ~Value((Value *)&local_1a8);
  }
  else if (*(char *)&this->bits_ != '\x06') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8.bool_);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"in Json::Value::resize(): requires arrayValue",0x2d);
    std::__cxx11::stringbuf::str();
    throwLogicError(&SStack_1c8);
  }
  AVar1 = size(this);
  if (newSize == 0) {
    clear(this);
  }
  else if (AVar1 < newSize) {
    do {
      operator[](this,AVar1);
      AVar1 = AVar1 + 1;
    } while (newSize != AVar1);
  }
  else {
    if (newSize < AVar1) {
      AVar2 = newSize;
      do {
        this_00 = &((this->value_).map_)->_M_t;
        local_1a8.int_ = 0;
        local_1a0 = AVar2;
        pVar3 = std::
                _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                ::equal_range(this_00,(key_type *)&local_1a8);
        std::
        _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
        ::_M_erase_aux(this_00,(_Base_ptr)pVar3.first._M_node,(_Base_ptr)pVar3.second._M_node);
        if ((local_1a8 != (void *)0x0) && ((local_1a0 & 3) == 1)) {
          free(local_1a8.string_);
        }
        AVar2 = AVar2 + 1;
      } while (AVar1 != AVar2);
    }
    AVar1 = size(this);
    if (AVar1 != newSize) {
      local_1a8.string_ = local_198;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"assert json failed","");
      throwLogicError((String *)&local_1a8);
    }
  }
  return;
}

Assistant:

void Value::resize(ArrayIndex newSize) {
  JSON_ASSERT_MESSAGE(type() == nullValue || type() == arrayValue,
                      "in Json::Value::resize(): requires arrayValue");
  if (type() == nullValue)
    *this = Value(arrayValue);
  ArrayIndex oldSize = size();
  if (newSize == 0)
    clear();
  else if (newSize > oldSize)
    for (ArrayIndex i = oldSize; i < newSize; ++i)
      (*this)[i];
  else {
    for (ArrayIndex index = newSize; index < oldSize; ++index) {
      value_.map_->erase(index);
    }
    JSON_ASSERT(size() == newSize);
  }
}